

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O3

void __thiscall OptionRecordString::~OptionRecordString(OptionRecordString *this)

{
  pointer pcVar1;
  
  (this->super_OptionRecord)._vptr_OptionRecord = (_func_int **)&PTR__OptionRecordString_00440c20;
  pcVar1 = (this->default_value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->default_value).field_2) {
    operator_delete(pcVar1);
  }
  OptionRecord::~OptionRecord(&this->super_OptionRecord);
  return;
}

Assistant:

virtual ~OptionRecordString() {}